

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

Bool prvTidyIsXMLLetter(uint c)

{
  ushort uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  undefined4 in_R10D;
  int iVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  uVar11 = CONCAT44(c,c) & 0xffffffdfffffffff;
  iVar8 = (int)uVar11;
  auVar22._0_4_ = -(uint)(-0x7ffffff6 < (int)(c - 0x134 ^ 0x80000000));
  auVar22._4_4_ = -(uint)(-0x7ffffff9 < (int)(c - 0x141 ^ 0x80000000));
  auVar22._8_4_ = -(uint)(-0x7fffffcc < (int)(c - 0x14a ^ 0x80000000));
  auVar22._12_4_ = -(uint)(-0x7fffffbd < (int)(c - 0x180 ^ 0x80000000));
  auVar16._0_4_ = -(uint)(-0x7fffffea < (int)(iVar8 - 0xc0U ^ 0x80000000));
  auVar16._4_4_ = -(uint)(-0x7fffffe7 < (int)((int)(uVar11 >> 0x20) - 0x41U ^ 0x80000000));
  auVar16._8_4_ = -(uint)(-0x7fffffe2 < (int)(iVar8 - 0xd8U ^ 0x80000000));
  auVar16._12_4_ = -(uint)(-0x7fffffcf < (int)(iVar8 - 0x100U ^ 0x80000000));
  auVar16 = packssdw(auVar16,auVar22);
  auVar16 = packsswb(auVar16,auVar16);
  if ((((((byte)(SUB161(auVar16 >> 7,0) & 1 | (SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                 (SUB161(auVar16 >> 0x17,0) & 1) << 2 | (SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                 (SUB161(auVar16 >> 0x27,0) & 1) << 4 | (SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                 (SUB161(auVar16 >> 0x37,0) & 1) << 6 | SUB161(auVar16 >> 0x3f,0) << 7) == 0xff) &&
        (0x23 < c - 0x1cd)) && (0x1d < c - 0x1fa)) &&
      (((0x58 < c - 0x250 && (uVar3 = c & 0xfffffff8, uVar3 != 0xf8)) &&
       ((uVar4 = c & 0xfffffffe, uVar4 != 500 && (6 < c - 699)))))) &&
     (((6 < c - 0x386 || ((0x5dU >> (c - 0x386 & 0x1f) & 1) == 0)) &&
      ((0x2b < c - 0x3a3 && 0x13 < c - 0x38e &&
       ((0x10 < c - 0x3d0 || ((0x1547fU >> (c - 0x3d0 & 0x1f) & 1) == 0)))))))) {
    auVar23._0_4_ = -(uint)(-0x7fffffdd < (int)(c - 0x45e ^ 0x80000000));
    auVar23._4_4_ = -(uint)(-0x7fffffcc < (int)(c - 0x490 ^ 0x80000000));
    auVar23._8_4_ = -(uint)(-0x7fffffff < (int)(c - 0x4c7 ^ 0x80000000));
    auVar23._12_4_ = -(uint)(-0x7fffffff < (int)(c - 0x4cb ^ 0x80000000));
    auVar17._0_4_ = -(uint)(-0x7fffffef < (int)(c - 0x3e2 ^ 0x80000000));
    auVar17._4_4_ = -(uint)(-0x7ffffff5 < (int)(c - 0x401 ^ 0x80000000));
    auVar17._8_4_ = -(uint)(-0x7fffffbf < (int)(c - 0x40e ^ 0x80000000));
    auVar17._12_4_ = -(uint)(-0x7ffffff5 < (int)(c - 0x451 ^ 0x80000000));
    auVar16 = packssdw(auVar17,auVar23);
    auVar16 = packsswb(auVar16,auVar16);
    if (((byte)(SUB161(auVar16 >> 7,0) & 1 | (SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                (SUB161(auVar16 >> 0x17,0) & 1) << 2 | (SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                (SUB161(auVar16 >> 0x27,0) & 1) << 4 | (SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                (SUB161(auVar16 >> 0x37,0) & 1) << 6 | SUB161(auVar16 >> 0x3f,0) << 7) == 0xff) &&
       (((0x1b < c - 0x4d0 && (7 < c - 0x4ee)) && (uVar4 != 0x4f8)))) {
      auVar24._0_4_ = -(uint)(-0x7fffffdb < (int)(c - 0x531 ^ 0x80000000));
      auVar24._4_4_ = -(uint)(-0x7fffffdb < (int)(c - 0x561 ^ 0x80000000));
      auVar24._8_4_ = -(uint)(-0x7fffffe6 < (int)(c - 0x5d0 ^ 0x80000000));
      auVar24._12_4_ = -(uint)(-0x7ffffffe < (int)(c - 0x5f0 ^ 0x80000000));
      auVar18._0_4_ = -(uint)(-0x7fffffe7 < (int)(c - 0x621 ^ 0x80000000));
      auVar18._4_4_ = -(uint)(-0x7ffffff7 < (int)(c - 0x641 ^ 0x80000000));
      auVar18._8_4_ = -(uint)(-0x7fffffba < (int)(c - 0x671 ^ 0x80000000));
      auVar18._12_4_ = -(uint)(-0x7ffffffc < (int)(c - 0x6ba ^ 0x80000000));
      auVar16 = packssdw(auVar24,auVar18);
      auVar16 = packsswb(auVar16,auVar16);
      if (((((0xe < c - 0x6c0 && c != 0x559) &&
             (byte)(SUB161(auVar16 >> 7,0) & 1 | (SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                    (SUB161(auVar16 >> 0x17,0) & 1) << 2 | (SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                    (SUB161(auVar16 >> 0x27,0) & 1) << 4 | (SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                    (SUB161(auVar16 >> 0x37,0) & 1) << 6 | SUB161(auVar16 >> 0x3f,0) << 7) == 0xff)
           && (uVar5 = c & 0xfffffffc, uVar5 != 0x6d0)) &&
          ((0x11 < c - 0x6d5 || ((0x30001U >> (c - 0x6d5 & 0x1f) & 1) == 0)))) &&
         (auVar19._0_4_ = -(uint)(-0x7fffffcc < (int)(c - 0x905 ^ 0x80000000)),
         auVar19._4_4_ = -(uint)(-0x7ffffff7 < (int)(c - 0x958 ^ 0x80000000)),
         auVar19._8_4_ = -(uint)(-0x7ffffff9 < (int)(c - 0x985 ^ 0x80000000)),
         auVar19._12_4_ = -(uint)(-0x7fffffff < (int)(c - 0x98f ^ 0x80000000)),
         iVar8 = movmskps(in_R10D,auVar19), (0x15 < c - 0x993 && c != 0x93d) && iVar8 == 0xf)) {
        if (c - 0x9aa < 9) {
          if ((0x17fU >> (c - 0x9aa & 0x1f) & 1) != 0) {
            return yes;
          }
        }
        else if (c - 0xa13 < 0x16) {
          return yes;
        }
        if ((((0x34 < c - 0xa2a) || ((0x1780000000db7fU >> ((ulong)(c - 0xa2a) & 0x3f) & 1) == 0))
            && ((0x34 < c - 0x9dc || ((0x187e000030003bU >> ((ulong)(c - 0x9dc) & 0x3f) & 1) == 0)))
            ) && ((3 < c - 0x9b6 && (2 < c - 0xa72)))) {
          if (c - 0xa85 < 9) {
            if ((0x17fU >> (c - 0xa85 & 0x1f) & 1) != 0) {
              return yes;
            }
          }
          else if (c - 0xa93 < 0x16) {
            return yes;
          }
          if ((((((0x36 < c - 0xaaa) ||
                 ((0x4000000008fb7fU >> ((ulong)(c - 0xaaa) & 0x3f) & 1) == 0)) && (2 < c - 0xa8f))
               && (0x15 < c - 0xb13)) &&
              (((0x38 < c - 0xb05 || ((0x11e6fe000000cffU >> ((ulong)(c - 0xb05) & 0x3f) & 1) == 0))
               && ((0x3d < c - 0xb5f ||
                   ((0x2c7b8fc000000007U >> ((ulong)(c - 0xb5f) & 0x3f) & 1) == 0)))))) &&
             (1 < c - 0xb5c)) {
            auVar25._0_4_ = -(uint)(-0x7fffffff < (int)(c - 0xba3 ^ 0x80000000));
            auVar25._4_4_ = -(uint)(-0x7ffffffe < (int)(c - 0xba8 ^ 0x80000000));
            auVar25._8_4_ = -(uint)(-0x7ffffff9 < (int)(c - 0xbae ^ 0x80000000));
            auVar25._12_4_ = -(uint)(-0x7ffffffe < (int)(c - 2999 ^ 0x80000000));
            auVar20._0_4_ = -(uint)(-0x7ffffff9 < (int)(c - 0xc05 ^ 0x80000000));
            auVar20._4_4_ = -(uint)(-0x7ffffffe < (int)(c - 0xc0e ^ 0x80000000));
            auVar20._8_4_ = -(uint)(-0x7fffffea < (int)(c - 0xc12 ^ 0x80000000));
            auVar20._12_4_ = -(uint)(-0x7ffffff7 < (int)(c - 0xc2a ^ 0x80000000));
            auVar16 = packssdw(auVar25,auVar20);
            auVar16 = packsswb(auVar16,auVar16);
            uVar1 = (ushort)(SUB161(auVar16 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7;
            if ((((((char)uVar1 == -1) &&
                  (auVar21._0_4_ = -(uint)(-0x7ffffffc < (int)(c - 0xc35 ^ 0x80000000)),
                  auVar21._4_4_ = -(uint)(-0x7ffffff9 < (int)(c - 0xc85 ^ 0x80000000)),
                  auVar21._8_4_ = -(uint)(-0x7ffffffe < (int)(c - 0xc8e ^ 0x80000000)),
                  auVar21._12_4_ = -(uint)(-0x7fffffea < (int)(c - 0xc92 ^ 0x80000000)),
                  uVar2 = movmskps((ushort)(uVar1 | (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                                            (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                                            (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                                            (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                                            (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                                            (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                                            (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                                           (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) ^ 0xff,auVar21)
                  , (char)uVar2 == '\x0f')) &&
                 (((9 < c - 0xcaa && (((uVar4 != 0xb9e && (uVar4 != 0xc60)) && (4 < c - 0xcb5)))) &&
                  (((c != 0xcde &&
                    (auVar12._0_4_ = -(uint)(-0x7ffffff9 < (int)(c - 0xd05 ^ 0x80000000)),
                    auVar12._4_4_ = -(uint)(-0x7ffffffe < (int)(c - 0xd0e ^ 0x80000000)),
                    auVar12._8_4_ = -(uint)(-0x7fffffea < (int)(c - 0xd12 ^ 0x80000000)),
                    auVar12._12_4_ = -(uint)(-0x7ffffff1 < (int)(c - 0xd2a ^ 0x80000000)),
                    iVar8 = movmskps(c - 0xcb5,auVar12), iVar8 == 0xf)) && (0x2d < c - 0xe01))))))
                && ((uVar4 != 0xce0 && (uVar4 != 0xd60)))) &&
               (((0x15 < c - 0xe30 || ((0x3f000dU >> (c - 0xe30 & 0x1f) & 1) == 0)) &&
                ((0xc < c - 0xe81 || ((0x12cbU >> (c - 0xe81 & 0x1f) & 1) == 0)))))) {
              uVar7 = c - 0xe99;
              bVar6 = uVar7 < 7 || uVar5 == 0xe94;
              if (uVar7 >= 7 && uVar5 != 0xe94) {
                if (c - 0xea1 < 7) {
                  bVar6 = 0x57 >> ((byte)(c - 0xea1) & 0x1f);
                  if (uVar4 == 0xeaa || (bVar6 & 1) != 0) {
                    return yes;
                  }
                }
                else if (uVar4 == 0xeaa) {
                  return yes;
                }
                uVar2 = CONCAT31((int3)(uVar7 >> 8),bVar6);
                if ((0x10 < c - 0xead) ||
                   (uVar2 = 0x1006b, (0x1006bU >> (c - 0xead & 0x1f) & 1) == 0)) {
                  auVar13._0_4_ = -(uint)(-0x7ffffffc < (int)(c - 0xec0 ^ 0x80000000));
                  auVar13._4_4_ = -(uint)(-0x7fffffe0 < (int)(c - 0xf49 ^ 0x80000000));
                  auVar13._8_4_ = -(uint)(-0x7fffffdb < (int)(c - 0x10a0 ^ 0x80000000));
                  auVar13._12_4_ = -(uint)(-0x7fffffda < (int)(c - 0x10d0 ^ 0x80000000));
                  iVar8 = movmskps(uVar2,auVar13);
                  uVar7 = CONCAT31((int3)((uint)iVar8 >> 8),iVar8 != 0xf || uVar3 == 0xf40);
                  if (iVar8 == 0xf && uVar3 != 0xf40) {
                    if (c - 0x1100 < 10) {
                      uVar7 = 0x2ed >> ((byte)(c - 0x1100) & 0x1f);
                      if (c - 0x110b < 2 || (uVar7 & 1) != 0) {
                        return yes;
                      }
                    }
                    else if (c - 0x110b < 2) {
                      return yes;
                    }
                    if ((((((0x2d < c - 0x113c) ||
                           (uVar7 = 0x23150015,
                           (0x2ab823150015U >> ((ulong)(c - 0x113c) & 0x3f) & 1) == 0)) &&
                          (4 < c - 0x110e)) &&
                         ((1 < c - 0x116d &&
                          ((0x39 < c - 0x1172 ||
                           (uVar7 = 0xb,
                           (0x24010000000000bU >> ((ulong)(c - 0x1172) & 0x3f) & 1) == 0)))))) &&
                        (uVar4 != 0x11ae)) &&
                       (((0x3f < c - 0x11ba ||
                         ((0x80420000000001fdU >> ((ulong)(c - 0x11ba) & 0x3f) & 1) == 0)) &&
                        (1 < c - 0x11b7)))) {
                      bVar9 = c - 0x1f20 < 0x26;
                      uVar4 = c - 0x1f48;
                      auVar14._0_4_ = -(uint)(-0x7fffff65 < (int)(c - 0x1e00 ^ 0x80000000));
                      auVar14._4_4_ = -(uint)(-0x7fffffa7 < (int)(c - 0x1ea0 ^ 0x80000000));
                      auVar14._8_4_ = -(uint)(-0x7fffffeb < (int)(c - 0x1f00 ^ 0x80000000));
                      auVar14._12_4_ = -(uint)(-0x7ffffffb < (int)(c - 0x1f18 ^ 0x80000000));
                      iVar8 = movmskps(uVar7,auVar14);
                      if (((((((uVar4 >= 6 && !bVar9) && iVar8 == 0xf) && (0x34 < c - 0x1f80)) &&
                            (0x1e < c - 0x1f5f)) && ((c != 0x1f5d && (uVar3 != 0x1f50)))) &&
                          ((c & 0xfffffffd) != 0x1f59)) &&
                         ((8 < c - 0x1fb6 || ((0x17fU >> (c - 0x1fb6 & 0x1f) & 1) == 0)))) {
                        uVar3 = c - 0x1ff2;
                        auVar15._0_4_ = -(uint)(-0x7ffffffe < (int)(c - 0x1fc2 ^ 0x80000000));
                        auVar15._4_4_ = -(uint)(-0x7ffffffa < (int)(c - 0x1fc6 ^ 0x80000000));
                        auVar15._8_4_ = -(uint)(-0x7ffffffb < (int)(c - 0x1fd6 ^ 0x80000000));
                        auVar15._12_4_ = -(uint)(-0x7ffffff4 < (int)(c - 0x1fe0 ^ 0x80000000));
                        iVar8 = movmskps(CONCAT31((int3)(uVar4 >> 8),
                                                  (uVar4 < 6 || bVar9) || iVar8 != 0xf),auVar15);
                        uVar2 = CONCAT31((int3)(uVar3 >> 8),
                                         (uVar3 < 3 || uVar5 == 0x1fd0) || iVar8 != 0xf);
                        if ((((uVar3 >= 3 && uVar5 != 0x1fd0) && iVar8 == 0xf) && (6 < c - 0x1ff6))
                           && (((8 < c - 0x2126 ||
                                (uVar2 = 0x131, (0x131U >> (c - 0x2126 & 0x1f) & 1) == 0)) &&
                               (auVar10._0_4_ =
                                     -(uint)(-0x7ffffffe < (int)(c - 0x2180 ^ 0x80000000)),
                               auVar10._4_4_ = -(uint)(-0x7fffffad < (int)(c - 0x3041 ^ 0x80000000))
                               , auVar10._8_4_ =
                                      -(uint)(-0x7fffffa7 < (int)(c - 0x30a1 ^ 0x80000000)),
                               auVar10._12_4_ =
                                    -(uint)(-0x7fffffd9 < (int)(c - 0x3105 ^ 0x80000000)),
                               iVar8 = movmskps(uVar2,auVar10), iVar8 == 0xf && 0x2ba3 < c - 0xac00)
                               ))) {
                          return (Bool)((c - 0x3021 < 9 || c - 0x4e00 < 0x51a6) || c == 0x3007);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return yes;
}

Assistant:

Bool TY_(IsXMLLetter)(uint c)
{
    return ((c >= 0x41 && c <= 0x5a) ||
        (c >= 0x61 && c <= 0x7a) ||
        (c >= 0xc0 && c <= 0xd6) ||
        (c >= 0xd8 && c <= 0xf6) ||
        (c >= 0xf8 && c <= 0xff) ||
        (c >= 0x100 && c <= 0x131) ||
        (c >= 0x134 && c <= 0x13e) ||
        (c >= 0x141 && c <= 0x148) ||
        (c >= 0x14a && c <= 0x17e) ||
        (c >= 0x180 && c <= 0x1c3) ||
        (c >= 0x1cd && c <= 0x1f0) ||
        (c >= 0x1f4 && c <= 0x1f5) ||
        (c >= 0x1fa && c <= 0x217) ||
        (c >= 0x250 && c <= 0x2a8) ||
        (c >= 0x2bb && c <= 0x2c1) ||
        c == 0x386 ||
        (c >= 0x388 && c <= 0x38a) ||
        c == 0x38c ||
        (c >= 0x38e && c <= 0x3a1) ||
        (c >= 0x3a3 && c <= 0x3ce) ||
        (c >= 0x3d0 && c <= 0x3d6) ||
        c == 0x3da ||
        c == 0x3dc ||
        c == 0x3de ||
        c == 0x3e0 ||
        (c >= 0x3e2 && c <= 0x3f3) ||
        (c >= 0x401 && c <= 0x40c) ||
        (c >= 0x40e && c <= 0x44f) ||
        (c >= 0x451 && c <= 0x45c) ||
        (c >= 0x45e && c <= 0x481) ||
        (c >= 0x490 && c <= 0x4c4) ||
        (c >= 0x4c7 && c <= 0x4c8) ||
        (c >= 0x4cb && c <= 0x4cc) ||
        (c >= 0x4d0 && c <= 0x4eb) ||
        (c >= 0x4ee && c <= 0x4f5) ||
        (c >= 0x4f8 && c <= 0x4f9) ||
        (c >= 0x531 && c <= 0x556) ||
        c == 0x559 ||
        (c >= 0x561 && c <= 0x586) ||
        (c >= 0x5d0 && c <= 0x5ea) ||
        (c >= 0x5f0 && c <= 0x5f2) ||
        (c >= 0x621 && c <= 0x63a) ||
        (c >= 0x641 && c <= 0x64a) ||
        (c >= 0x671 && c <= 0x6b7) ||
        (c >= 0x6ba && c <= 0x6be) ||
        (c >= 0x6c0 && c <= 0x6ce) ||
        (c >= 0x6d0 && c <= 0x6d3) ||
        c == 0x6d5 ||
        (c >= 0x6e5 && c <= 0x6e6) ||
        (c >= 0x905 && c <= 0x939) ||
        c == 0x93d ||
        (c >= 0x958 && c <= 0x961) ||
        (c >= 0x985 && c <= 0x98c) ||
        (c >= 0x98f && c <= 0x990) ||
        (c >= 0x993 && c <= 0x9a8) ||
        (c >= 0x9aa && c <= 0x9b0) ||
        c == 0x9b2 ||
        (c >= 0x9b6 && c <= 0x9b9) ||
        (c >= 0x9dc && c <= 0x9dd) ||
        (c >= 0x9df && c <= 0x9e1) ||
        (c >= 0x9f0 && c <= 0x9f1) ||
        (c >= 0xa05 && c <= 0xa0a) ||
        (c >= 0xa0f && c <= 0xa10) ||
        (c >= 0xa13 && c <= 0xa28) ||
        (c >= 0xa2a && c <= 0xa30) ||
        (c >= 0xa32 && c <= 0xa33) ||
        (c >= 0xa35 && c <= 0xa36) ||
        (c >= 0xa38 && c <= 0xa39) ||
        (c >= 0xa59 && c <= 0xa5c) ||
        c == 0xa5e ||
        (c >= 0xa72 && c <= 0xa74) ||
        (c >= 0xa85 && c <= 0xa8b) ||
        c == 0xa8d ||
        (c >= 0xa8f && c <= 0xa91) ||
        (c >= 0xa93 && c <= 0xaa8) ||
        (c >= 0xaaa && c <= 0xab0) ||
        (c >= 0xab2 && c <= 0xab3) ||
        (c >= 0xab5 && c <= 0xab9) ||
        c == 0xabd ||
        c == 0xae0 ||
        (c >= 0xb05 && c <= 0xb0c) ||
        (c >= 0xb0f && c <= 0xb10) ||
        (c >= 0xb13 && c <= 0xb28) ||
        (c >= 0xb2a && c <= 0xb30) ||
        (c >= 0xb32 && c <= 0xb33) ||
        (c >= 0xb36 && c <= 0xb39) ||
        c == 0xb3d ||
        (c >= 0xb5c && c <= 0xb5d) ||
        (c >= 0xb5f && c <= 0xb61) ||
        (c >= 0xb85 && c <= 0xb8a) ||
        (c >= 0xb8e && c <= 0xb90) ||
        (c >= 0xb92 && c <= 0xb95) ||
        (c >= 0xb99 && c <= 0xb9a) ||
        c == 0xb9c ||
        (c >= 0xb9e && c <= 0xb9f) ||
        (c >= 0xba3 && c <= 0xba4) ||
        (c >= 0xba8 && c <= 0xbaa) ||
        (c >= 0xbae && c <= 0xbb5) ||
        (c >= 0xbb7 && c <= 0xbb9) ||
        (c >= 0xc05 && c <= 0xc0c) ||
        (c >= 0xc0e && c <= 0xc10) ||
        (c >= 0xc12 && c <= 0xc28) ||
        (c >= 0xc2a && c <= 0xc33) ||
        (c >= 0xc35 && c <= 0xc39) ||
        (c >= 0xc60 && c <= 0xc61) ||
        (c >= 0xc85 && c <= 0xc8c) ||
        (c >= 0xc8e && c <= 0xc90) ||
        (c >= 0xc92 && c <= 0xca8) ||
        (c >= 0xcaa && c <= 0xcb3) ||
        (c >= 0xcb5 && c <= 0xcb9) ||
        c == 0xcde ||
        (c >= 0xce0 && c <= 0xce1) ||
        (c >= 0xd05 && c <= 0xd0c) ||
        (c >= 0xd0e && c <= 0xd10) ||
        (c >= 0xd12 && c <= 0xd28) ||
        (c >= 0xd2a && c <= 0xd39) ||
        (c >= 0xd60 && c <= 0xd61) ||
        (c >= 0xe01 && c <= 0xe2e) ||
        c == 0xe30 ||
        (c >= 0xe32 && c <= 0xe33) ||
        (c >= 0xe40 && c <= 0xe45) ||
        (c >= 0xe81 && c <= 0xe82) ||
        c == 0xe84 ||
        (c >= 0xe87 && c <= 0xe88) ||
        c == 0xe8a ||
        c == 0xe8d ||
        (c >= 0xe94 && c <= 0xe97) ||
        (c >= 0xe99 && c <= 0xe9f) ||
        (c >= 0xea1 && c <= 0xea3) ||
        c == 0xea5 ||
        c == 0xea7 ||
        (c >= 0xeaa && c <= 0xeab) ||
        (c >= 0xead && c <= 0xeae) ||
        c == 0xeb0 ||
        (c >= 0xeb2 && c <= 0xeb3) ||
        c == 0xebd ||
        (c >= 0xec0 && c <= 0xec4) ||
        (c >= 0xf40 && c <= 0xf47) ||
        (c >= 0xf49 && c <= 0xf69) ||
        (c >= 0x10a0 && c <= 0x10c5) ||
        (c >= 0x10d0 && c <= 0x10f6) ||
        c == 0x1100 ||
        (c >= 0x1102 && c <= 0x1103) ||
        (c >= 0x1105 && c <= 0x1107) ||
        c == 0x1109 ||
        (c >= 0x110b && c <= 0x110c) ||
        (c >= 0x110e && c <= 0x1112) ||
        c == 0x113c ||
        c == 0x113e ||
        c == 0x1140 ||
        c == 0x114c ||
        c == 0x114e ||
        c == 0x1150 ||
        (c >= 0x1154 && c <= 0x1155) ||
        c == 0x1159 ||
        (c >= 0x115f && c <= 0x1161) ||
        c == 0x1163 ||
        c == 0x1165 ||
        c == 0x1167 ||
        c == 0x1169 ||
        (c >= 0x116d && c <= 0x116e) ||
        (c >= 0x1172 && c <= 0x1173) ||
        c == 0x1175 ||
        c == 0x119e ||
        c == 0x11a8 ||
        c == 0x11ab ||
        (c >= 0x11ae && c <= 0x11af) ||
        (c >= 0x11b7 && c <= 0x11b8) ||
        c == 0x11ba ||
        (c >= 0x11bc && c <= 0x11c2) ||
        c == 0x11eb ||
        c == 0x11f0 ||
        c == 0x11f9 ||
        (c >= 0x1e00 && c <= 0x1e9b) ||
        (c >= 0x1ea0 && c <= 0x1ef9) ||
        (c >= 0x1f00 && c <= 0x1f15) ||
        (c >= 0x1f18 && c <= 0x1f1d) ||
        (c >= 0x1f20 && c <= 0x1f45) ||
        (c >= 0x1f48 && c <= 0x1f4d) ||
        (c >= 0x1f50 && c <= 0x1f57) ||
        c == 0x1f59 ||
        c == 0x1f5b ||
        c == 0x1f5d ||
        (c >= 0x1f5f && c <= 0x1f7d) ||
        (c >= 0x1f80 && c <= 0x1fb4) ||
        (c >= 0x1fb6 && c <= 0x1fbc) ||
        c == 0x1fbe ||
        (c >= 0x1fc2 && c <= 0x1fc4) ||
        (c >= 0x1fc6 && c <= 0x1fcc) ||
        (c >= 0x1fd0 && c <= 0x1fd3) ||
        (c >= 0x1fd6 && c <= 0x1fdb) ||
        (c >= 0x1fe0 && c <= 0x1fec) ||
        (c >= 0x1ff2 && c <= 0x1ff4) ||
        (c >= 0x1ff6 && c <= 0x1ffc) ||
        c == 0x2126 ||
        (c >= 0x212a && c <= 0x212b) ||
        c == 0x212e ||
        (c >= 0x2180 && c <= 0x2182) ||
        (c >= 0x3041 && c <= 0x3094) ||
        (c >= 0x30a1 && c <= 0x30fa) ||
        (c >= 0x3105 && c <= 0x312c) ||
        (c >= 0xac00 && c <= 0xd7a3) ||
        (c >= 0x4e00 && c <= 0x9fa5) ||
        c == 0x3007 ||
        (c >= 0x3021 && c <= 0x3029) ||
        (c >= 0x4e00 && c <= 0x9fa5) ||
        c == 0x3007 ||
        (c >= 0x3021 && c <= 0x3029));
}